

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BetweenTests.cpp
# Opt level: O3

void __thiscall IsNotBetweenTests::~IsNotBetweenTests(IsNotBetweenTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::Between(5,10)(7) is Not::True", []()
		{
			AssertThat(ut11::Is::Not::Between(5, 10)(7), ut11::Is::Not::True);
		});

		Then("Is::Not::Between(5,10)(12) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::Between(5, 10)(12), ut11::Is::Not::False);
		});

		Then("Is::Not::Between(5,10)(3) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::Between(5, 10)(3), ut11::Is::Not::False);
		});

		Then("Is::Not::Between is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::Between(5,10)) >::value, ut11::Is::True);
		});

		Then("Is::Not::Between has an error message", []() {
			AssertThat(ut11::Is::Not::Between(5, 10).GetErrorMessage(3), ut11::Is::Not::EqualTo(""));
		});
	}